

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O3

_Bool split_mmio_region(uc_struct *uc,MemoryRegion *mr,uint64_t address,size_t size,_Bool do_delete)

{
  ulong uVar1;
  ulong address_00;
  ulong uVar2;
  undefined8 *puVar3;
  uc_cb_mmio_read_t read_cb;
  void *user_data_read;
  uc_cb_mmio_write_t write_cb;
  void *user_data_write;
  uc_err uVar4;
  ulong address_01;
  uint64_t address_02;
  
  uVar1 = size + address;
  address_00 = mr->addr;
  if ((address <= address_00) && (mr->end <= uVar1)) {
    return true;
  }
  if (size != 0) {
    if (*(long *)((long)&mr->size + 8) != 0) {
      __assert_fail("r == a",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                    ,0x16,"uint64_t int128_get64(Int128)");
    }
    uVar2 = mr->end;
    puVar3 = (undefined8 *)mr->opaque;
    read_cb = (uc_cb_mmio_read_t)*puVar3;
    user_data_read = (void *)puVar3[1];
    write_cb = (uc_cb_mmio_write_t)puVar3[2];
    user_data_write = (void *)puVar3[3];
    uVar4 = uc_mem_unmap(uc,address_00,(size_t)mr->size);
    if (uVar4 == UC_ERR_OK) {
      address_02 = address;
      if (address < address_00) {
        address_02 = address_00;
      }
      address_01 = uVar2;
      if (uVar1 < uVar2) {
        address_01 = uVar1;
      }
      if ((((address <= address_00) ||
           (uVar4 = uc_mmio_map(uc,address_00,address_02 - address_00,read_cb,user_data_read,
                                write_cb,user_data_write), uVar4 == UC_ERR_OK)) &&
          ((address_01 == address_02 || do_delete ||
           (uVar4 = uc_mmio_map(uc,address_02,address_01 - address_02,read_cb,user_data_read,
                                write_cb,user_data_write), uVar4 == UC_ERR_OK)))) &&
         ((uVar2 <= uVar1 ||
          (uVar4 = uc_mmio_map(uc,address_01,uVar2 - address_01,read_cb,user_data_read,write_cb,
                               user_data_write), uVar4 == UC_ERR_OK)))) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool split_mmio_region(struct uc_struct *uc, MemoryRegion *mr,
                              uint64_t address, size_t size, bool do_delete)
{
    uint64_t begin, end, chunk_end;
    size_t l_size, r_size, m_size;
    mmio_cbs backup;

    chunk_end = address + size;

    // This branch also break recursion.
    if (address <= mr->addr && chunk_end >= mr->end) {
        return true;
    }

    if (size == 0) {
        return false;
    }

    begin = mr->addr;
    end = mr->end;

    memcpy(&backup, mr->opaque, sizeof(mmio_cbs));

    /* overlapping cases
     *               |------mr------|
     * case 1    |---size--|            // Is it possible???
     * case 2           |--size--|
     * case 3                  |---size--|
     */

    // unmap this region first, then do split it later
    if (uc_mem_unmap(uc, mr->addr, (size_t)int128_get64(mr->size)) !=
        UC_ERR_OK) {
        return false;
    }

    // adjust some things
    if (address < begin) {
        address = begin;
    }
    if (chunk_end > end) {
        chunk_end = end;
    }

    // compute sub region sizes
    l_size = (size_t)(address - begin);
    r_size = (size_t)(end - chunk_end);
    m_size = (size_t)(chunk_end - address);

    if (l_size > 0) {
        if (uc_mmio_map(uc, begin, l_size, backup.read, backup.user_data_read,
                        backup.write, backup.user_data_write) != UC_ERR_OK) {
            return false;
        }
    }

    if (m_size > 0 && !do_delete) {
        if (uc_mmio_map(uc, address, m_size, backup.read, backup.user_data_read,
                        backup.write, backup.user_data_write) != UC_ERR_OK) {
            return false;
        }
    }

    if (r_size > 0) {
        if (uc_mmio_map(uc, chunk_end, r_size, backup.read,
                        backup.user_data_read, backup.write,
                        backup.user_data_write) != UC_ERR_OK) {
            return false;
        }
    }

    return true;
}